

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseSignalSuffix(Ver_Man_t *pMan,char *pWord,int *pnMsb,int *pnLsb)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *__nptr;
  long lVar4;
  
  sVar2 = strlen(pWord);
  if (pWord[(long)((sVar2 << 0x20) + -0x100000000) >> 0x20] != ']') {
    __assert_fail("pWord[Length-1] == \']\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verCore.c"
                  ,0x2c0,"int Ver_ParseSignalSuffix(Ver_Man_t *, char *, int *, int *)");
  }
  lVar4 = (long)(sVar2 << 0x20) >> 0x20;
  lVar3 = lVar4;
  if (pWord + lVar4 + -2 != pWord) {
    do {
      if (pWord[lVar3 + -2] == ':') {
        iVar1 = atoi(pWord + lVar3 + -1);
        *pnLsb = iVar1;
        goto LAB_00351c45;
      }
      if (pWord[lVar3 + -2] == '[') {
        __nptr = pWord + lVar3 + -1;
        iVar1 = atoi(__nptr);
        *pnLsb = iVar1;
        goto LAB_00351c86;
      }
      lVar3 = lVar3 + -1;
    } while (lVar3 != 2);
  }
LAB_00351c56:
  sprintf(pMan->sError,"Cannot find opening bracket in signal name %s.",pWord);
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
  while (lVar4 = lVar4 + -1, lVar4 != 2) {
LAB_00351c45:
    if (pWord[lVar4 + -2] == '[') {
      __nptr = pWord + lVar4 + -1;
      iVar1 = atoi(__nptr);
LAB_00351c86:
      *pnMsb = iVar1;
      __nptr[-1] = '\0';
      return 1;
    }
  }
  goto LAB_00351c56;
}

Assistant:

int Ver_ParseSignalSuffix( Ver_Man_t * pMan, char * pWord, int * pnMsb, int * pnLsb )
{
    char * pCur;
    int Length;
    Length = strlen(pWord);
    assert( pWord[Length-1] == ']' );
    // walk backward
    for ( pCur = pWord + Length - 2; pCur != pWord; pCur-- )
        if ( *pCur == ':' || *pCur == '[' )
            break;
    if ( pCur == pWord )
    {
        sprintf( pMan->sError, "Cannot find opening bracket in signal name %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    if ( *pCur == '[' )
    {
        *pnMsb = *pnLsb = atoi(pCur+1);
        *pCur = 0;
        return 1;
    }
    assert( *pCur == ':' );
    // get the end of the interval
    *pnLsb = atoi(pCur+1);
    // find the beginning
    for ( pCur = pWord + Length - 2; pCur != pWord; pCur-- )
        if ( *pCur == '[' )
            break;
    if ( pCur == pWord )
    {
        sprintf( pMan->sError, "Cannot find opening bracket in signal name %s.", pWord );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    assert( *pCur == '[' );
    // get the beginning of the interval
    *pnMsb = atoi(pCur+1);
    // cut the word
    *pCur = 0;
    return 1;
}